

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

QDateTimeEditPrivate * __thiscall
QDateTimeEditPrivate::validateAndInterpret
          (QDateTimeEditPrivate *this,QString *input,int *position,State *state,bool fixup)

{
  char16_t cVar1;
  char16_t cVar2;
  State SVar3;
  ulong uVar4;
  ulong uVar5;
  storage_type_conflict *psVar6;
  char16_t *pcVar7;
  QArrayData *pQVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  byte bVar11;
  char cVar12;
  short sVar13;
  short sVar14;
  uint uVar15;
  bool bVar17;
  undefined7 in_register_00000081;
  uint *puVar18;
  char in_R9B;
  uint uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  bool bVar21;
  QStringView QVar22;
  QStringView QVar23;
  QArrayData *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  QArrayData *local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  ulong uVar16;
  
  puVar18 = (uint *)CONCAT71(in_register_00000081,fixup);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *(ulong *)(position + 4);
  if (uVar4 == 0) {
    uVar15 = 1;
    if (input[0x2b].d.size != 1) {
      uVar15 = (uint)(input[0x1b].d.size != 0);
    }
    *puVar18 = uVar15;
    (*(code *)(input->d).d[10].super_QArrayData.alloc)(&local_58,input);
    ::QVariant::toDateTime();
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    uVar5 = input[0x22].d.size;
    psVar6 = *(storage_type_conflict **)(position + 2);
    bVar11 = 1;
    if (uVar5 == uVar4) {
      QVar22.m_data = input[0x22].d.ptr;
      QVar22.m_size = uVar5;
      QVar23.m_data = psVar6;
      QVar23.m_size = uVar4;
      bVar11 = QtPrivate::equalStrings(QVar22,QVar23);
      bVar11 = bVar11 ^ 1;
    }
    if (bVar11 == 0 && in_R9B == '\0') {
      *puVar18 = *(uint *)&input[0x28].d.ptr;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        ::QVariant::toDateTime();
        return this;
      }
      goto LAB_003eed48;
    }
    uVar5 = input[0x1b].d.size;
    if (uVar5 != 0) {
      uVar16 = uVar4;
      if (uVar5 < uVar4) {
        uVar16 = uVar5;
      }
      uVar15 = (uint)uVar16;
      if ((int)uVar15 < 1) {
        uVar19 = 0;
        bVar17 = false;
      }
      else {
        pcVar7 = input[0x1b].d.ptr;
        uVar20 = 0;
        bVar17 = false;
        do {
          cVar1 = psVar6[uVar20];
          cVar2 = pcVar7[uVar20];
          bVar21 = true;
          if (cVar1 != cVar2) {
            sVar13 = QChar::toLower((uint)(ushort)cVar2);
            sVar14 = QChar::toLower((uint)(ushort)cVar1);
            bVar21 = sVar13 == sVar14;
            if (bVar21) {
              bVar17 = true;
            }
          }
          if (!bVar21) goto LAB_003ee97b;
          uVar20 = uVar20 + 1;
        } while ((uVar15 & 0x7fffffff) != uVar20);
        uVar20 = uVar16 & 0xffffffff;
LAB_003ee97b:
        uVar19 = (uint)uVar20;
      }
      if (uVar19 == uVar15) {
        *puVar18 = (uVar5 == uVar4) + 1;
        if (bVar17) {
          QString::left((QString *)&local_58,input + 0x1b,(long)(int)uVar15);
          pQVar8 = *(QArrayData **)position;
          uVar9 = *(undefined8 *)(position + 2);
          *(PrivateShared **)position = local_58.shared;
          *(undefined8 *)(position + 2) = local_58._8_8_;
          uVar10 = *(undefined8 *)(position + 4);
          *(undefined8 *)(position + 4) = local_58._16_8_;
          local_58.shared = (PrivateShared *)pQVar8;
          local_58._8_8_ = uVar9;
          local_58._16_8_ = uVar10;
          if (pQVar8 != (QArrayData *)0x0) {
            LOCK();
            (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar8,2,0x10);
            }
          }
        }
        ::QVariant::toDateTime();
        if (uVar19 == uVar15) goto LAB_003eed20;
      }
    }
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    SVar3 = *state;
    ::QVariant::toDateTime();
    QDateTimeParser::parse
              ((QString *)&local_98,(int)input + 0x3d8,(QDateTime *)position,SUB41(SVar3,0));
    QDateTime::~QDateTime((QDateTime *)local_58.data);
    QString::operator=((QString *)position,(QString *)(input + 0x2a));
    QDateTime::toTimeZone((QTimeZone *)&local_58.shared);
    pQVar8 = local_98;
    local_98 = (QArrayData *)local_58.shared;
    local_58.shared = (PrivateShared *)pQVar8;
    QDateTime::~QDateTime((QDateTime *)local_58.data);
    cVar12 = QDateTime::isValid();
    if ((cVar12 == '\0') && ((uint)uStack_90 == 2)) {
      uStack_90 = (undefined1 *)CONCAT44(uStack_90._4_4_,1);
    }
    *state = *state + uStack_90._4_4_;
    *puVar18 = (uint)uStack_90;
    if ((uint)uStack_90 == 2) {
      cVar12 = (char)local_88;
      if ((char)local_88 == '\x01') {
        ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_98);
        bVar11 = ::QVariant::equals((QVariant *)&input[0x33].d.size);
        bVar11 = bVar11 ^ 1;
      }
      else {
        bVar11 = 0;
      }
      if (cVar12 != '\0') {
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
      if (bVar11 == 0) {
        QString::operator=(input + 0x22,(QString *)position);
        *(uint *)&input[0x28].d.ptr = *puVar18;
        ::QVariant::QVariant(&local_78,(QDateTime *)&local_98);
        ::QVariant::operator=((QVariant *)(input + 0x23),&local_78);
        ::QVariant::~QVariant(&local_78);
      }
      else {
        ::QVariant::QVariant(&local_78,(QDateTime *)&local_98);
        ::QVariant::operator=((QVariant *)&input[0x33].d.size,&local_78);
        ::QVariant::~QVariant(&local_78);
        (*(code *)(input->d).d[0xf].super_QArrayData.alloc)(input);
        ::QVariant::QVariant(&local_78,(QDateTime *)&local_98);
        (*(code *)(input->d).d[0xd].super_QArrayData.alloc)(&local_b8,input,&local_78);
        pQVar8 = *(QArrayData **)position;
        uVar9 = *(undefined8 *)(position + 2);
        *(QArrayData **)position = local_b8;
        *(undefined8 *)(position + 2) = uStack_b0;
        uVar10 = *(undefined8 *)(position + 4);
        *(undefined8 *)(position + 4) = local_a8;
        local_b8 = pQVar8;
        uStack_b0 = uVar9;
        local_a8 = uVar10;
        if (pQVar8 != (QArrayData *)0x0) {
          LOCK();
          (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar8,2,0x10);
          }
        }
        ::QVariant::~QVariant(&local_78);
        ::QVariant::QVariant(&local_78,(QDateTime *)&local_98);
        updateCache((QDateTimeEditPrivate *)input,&local_78,(QString *)position);
        ::QVariant::~QVariant(&local_78);
        ::QVariant::clear();
      }
    }
    else {
      (*(code *)(input->d).d[0xf].super_QArrayData.alloc)(input);
    }
    cVar12 = QDateTime::isNull();
    if (cVar12 == '\0') {
      QDateTime::QDateTime((QDateTime *)this,(QDateTime *)&local_98);
    }
    else {
      (*(code *)(input->d).d[10].super_QArrayData.alloc)(&local_78,input);
      ::QVariant::toDateTime();
      ::QVariant::~QVariant(&local_78);
    }
    QDateTime::~QDateTime((QDateTime *)&local_98);
  }
LAB_003eed20:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_003eed48:
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEditPrivate::validateAndInterpret(QString &input, int &position,
                                                     QValidator::State &state, bool fixup) const
{
    if (input.isEmpty()) {
        if (sectionNodes.size() == 1 || !specialValueText.isEmpty()) {
            state = QValidator::Intermediate;
        } else {
            state = QValidator::Invalid;
        }
        return getZeroVariant().toDateTime();
    } else if (cachedText == input && !fixup) {
        state = cachedState;
        return cachedValue.toDateTime();
    } else if (!specialValueText.isEmpty()) {
        bool changeCase = false;
        const int max = qMin(specialValueText.size(), input.size());
        int i;
        for (i=0; i<max; ++i) {
            const QChar ic = input.at(i);
            const QChar sc = specialValueText.at(i);
            if (ic != sc) {
                if (sc.toLower() == ic.toLower()) {
                    changeCase = true;
                } else {
                    break;
                }
            }
        }
        if (i == max) {
            state = specialValueText.size() == input.size() ? QValidator::Acceptable : QValidator::Intermediate;
            if (changeCase) {
                input = specialValueText.left(max);
            }
            return minimum.toDateTime();
        }
    }

    StateNode tmp = parse(input, position, value.toDateTime(), fixup);
    // Take note of any corrections imposed during parsing:
    input = m_text;
    // TODO: if the format specifies time-zone, update timeZone to match the
    // parsed text; but we're in const context, so can't - QTBUG-118393.
    // Impose this widget's time system:
    tmp.value = tmp.value.toTimeZone(timeZone);
    // ... but that might turn a valid datetime into an invalid one:
    if (!tmp.value.isValid() && tmp.state == Acceptable)
        tmp.state = Intermediate;

    position += tmp.padded;
    state = QValidator::State(int(tmp.state));
    if (state == QValidator::Acceptable) {
        if (tmp.conflicts && conflictGuard != tmp.value) {
            conflictGuard = tmp.value;
            clearCache();
            input = textFromValue(tmp.value);
            updateCache(tmp.value, input);
            conflictGuard.clear();
        } else {
            cachedText = input;
            cachedState = state;
            cachedValue = tmp.value;
        }
    } else {
        clearCache();
    }
    return (tmp.value.isNull() ? getZeroVariant().toDateTime() : tmp.value);
}